

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON * cJSON_DetachItemFromObject(cJSON *object,char *string)

{
  cJSON *pcVar1;
  cJSON *pcVar2;
  cJSON *pcVar3;
  
  pcVar3 = get_object_item(object,string,0);
  if (pcVar3 == (cJSON *)0x0 || object == (cJSON *)0x0) {
    pcVar3 = (cJSON *)0x0;
  }
  else {
    pcVar1 = pcVar3->next;
    pcVar2 = pcVar3->prev;
    if (pcVar2 != (cJSON *)0x0) {
      pcVar2->next = pcVar1;
    }
    if (pcVar1 != (cJSON *)0x0) {
      pcVar1->prev = pcVar2;
    }
    if (object->child == pcVar3) {
      object->child = pcVar1;
    }
    pcVar3->next = (cJSON *)0x0;
    pcVar3->prev = (cJSON *)0x0;
  }
  return pcVar3;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_DetachItemFromObject(cJSON *object, const char *string)
{
    cJSON *to_detach = cJSON_GetObjectItem(object, string);

    return cJSON_DetachItemViaPointer(object, to_detach);
}